

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O0

int32_t __thiscall
icu_63::anon_unknown_0::MutableCodePointTrie::compactIndex
          (MutableCodePointTrie *this,int32_t fastILimit,UErrorCode *errorCode)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint32_t uVar6;
  bool bVar7;
  int32_t iVar8;
  int iVar9;
  uint32_t uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint16_t *puVar14;
  uint8_t local_19e1;
  int local_19d4;
  int32_t local_19d0;
  int32_t n_3;
  int32_t i2;
  int32_t i_3;
  int32_t i1;
  int32_t blockLength;
  int32_t start;
  int32_t n_2;
  uint32_t upperBits;
  uint32_t v;
  int32_t k;
  int32_t jLimit_1;
  int32_t j_2;
  int32_t n_1;
  int iStack_1998;
  uint8_t f;
  int32_t i3_2;
  int32_t i_2;
  int32_t indexLength;
  int32_t index3Start;
  int32_t i2Length;
  uint16_t index2 [2176];
  int32_t index16Capacity;
  int32_t index1Length;
  int32_t index2Capacity;
  int32_t n;
  uint32_t i3_1;
  bool isNull;
  uint32_t oredI3;
  int32_t jLimit;
  int32_t j_1;
  int32_t i_1;
  int32_t iLimit;
  int32_t iStart;
  int32_t index3Capacity;
  int32_t iNext;
  uint32_t i3;
  int32_t j;
  int32_t i;
  int32_t i3FirstNull;
  uint16_t fastIndex [1024];
  int32_t fastIndexLength;
  UErrorCode *errorCode_local;
  int32_t fastILimit_local;
  MutableCodePointTrie *this_local;
  
  this_local._4_4_ = fastILimit >> 2;
  if (this_local._4_4_ < this->highStart >> 6) {
    j = -1;
    i3 = 0;
    iNext = 0;
    while ((int)i3 < fastILimit) {
      index3Capacity = this->index[(int)i3];
      *(short *)((long)&i + (long)iNext * 2) = (short)index3Capacity;
      if (index3Capacity == this->dataNullOffset) {
        if (j < 0) {
          j = iNext;
        }
        else if ((this->index3NullOffset < 0) && (iNext - j == 0x1f)) {
          this->index3NullOffset = j;
        }
      }
      else {
        j = -1;
      }
      iVar9 = i3 + 4;
      while (i3 = i3 + 1, (int)i3 < iVar9) {
        index3Capacity = index3Capacity + 0x10;
        this->index[(int)i3] = index3Capacity;
      }
      iNext = iNext + 1;
    }
    iLimit = 0;
    j = this->index3NullOffset;
    iStack_1998 = 0x1000;
    if (fastILimit < 0x1000) {
      iStack_1998 = 0;
    }
    iVar9 = this->highStart >> 4;
    jLimit = iStack_1998;
    while (jLimit < iVar9) {
      oredI3 = jLimit;
      i3_1 = 0;
      bVar7 = true;
      do {
        i3_1 = this->index[(int)oredI3] | i3_1;
        if (this->index[(int)oredI3] != this->dataNullOffset) {
          bVar7 = false;
        }
        oredI3 = oredI3 + 1;
      } while ((int)oredI3 < jLimit + 0x20);
      if (bVar7) {
        this->flags[jLimit] = '\0';
        jLimit = oredI3;
        if (j < 0) {
          if (i3_1 < 0x10000) {
            iLimit = iLimit + 0x20;
          }
          else {
            iLimit = iLimit + 0x24;
          }
          j = 0;
        }
      }
      else if (i3_1 < 0x10000) {
        uVar10 = findSameBlock((uint16_t *)&i,0,this_local._4_4_,this->index,jLimit,0x20);
        if ((int)uVar10 < 0) {
          this->flags[jLimit] = '\x02';
          iLimit = iLimit + 0x20;
          jLimit = oredI3;
        }
        else {
          this->flags[jLimit] = '\x01';
          this->index[jLimit] = uVar10;
          jLimit = oredI3;
        }
      }
      else {
        this->flags[jLimit] = '\x03';
        iLimit = iLimit + 0x24;
        jLimit = oredI3;
      }
    }
    iVar11 = iVar9 - iStack_1998 >> 5;
    iVar12 = iVar11 + 0x1f >> 5;
    puVar14 = (uint16_t *)
              uprv_malloc_63((long)((this_local._4_4_ + iVar12 + iLimit + iVar11 + 1) * 2));
    this->index16 = puVar14;
    if (this->index16 == (uint16_t *)0x0) {
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
      this_local._4_4_ = 0;
    }
    else {
      memcpy(this->index16,&i,(long)(this_local._4_4_ << 1));
      indexLength = 0;
      j = this->index3NullOffset;
      iVar12 = this_local._4_4_ + iVar12;
      i3_2 = iVar12;
      for (; iVar8 = i3_2, iStack_1998 < iVar9; iStack_1998 = iStack_1998 + 0x20) {
        j_2._3_1_ = this->flags[iStack_1998];
        if ((j_2._3_1_ == '\0') && (j < 0)) {
          local_19e1 = '\x02';
          if (0xffff < this->dataNullOffset) {
            local_19e1 = '\x03';
          }
          j_2._3_1_ = local_19e1;
          j = 0;
        }
        if (j_2._3_1_ == '\0') {
          n_1 = this->index3NullOffset;
        }
        else if (j_2._3_1_ == '\x01') {
          n_1 = this->index[iStack_1998];
        }
        else if (j_2._3_1_ == '\x02') {
          n_1 = findSameBlock(this->index16,iVar12,i3_2,this->index,iStack_1998,0x20);
          if (n_1 < 0) {
            if (i3_2 == iVar12) {
              jLimit_1 = 0;
            }
            else {
              jLimit_1 = getOverlap(this->index16,i3_2,this->index,iStack_1998,0x20);
            }
            n_1 = i3_2 - jLimit_1;
            while (jLimit_1 < 0x20) {
              this->index16[i3_2] = (uint16_t)this->index[iStack_1998 + jLimit_1];
              jLimit_1 = jLimit_1 + 1;
              i3_2 = i3_2 + 1;
            }
          }
        }
        else {
          k = iStack_1998;
          upperBits = i3_2;
          do {
            uVar13 = this->index[k];
            this->index16[(int)(upperBits + 1)] = (uint16_t)uVar13;
            uVar1 = this->index[k + 1];
            this->index16[(int)(upperBits + 2)] = (uint16_t)uVar1;
            uVar2 = this->index[k + 2];
            this->index16[(int)(upperBits + 3)] = (uint16_t)uVar2;
            uVar10 = this->index[k + 3];
            this->index16[(int)(upperBits + 4)] = (uint16_t)uVar10;
            uVar3 = this->index[k + 4];
            this->index16[(int)(upperBits + 5)] = (uint16_t)uVar3;
            uVar4 = this->index[k + 5];
            this->index16[(int)(upperBits + 6)] = (uint16_t)uVar4;
            iVar11 = k + 7;
            uVar5 = this->index[k + 6];
            this->index16[(int)(upperBits + 7)] = (uint16_t)uVar5;
            k = k + 8;
            uVar6 = this->index[iVar11];
            this->index16[(int)(upperBits + 8)] = (uint16_t)uVar6;
            this->index16[(int)upperBits] =
                 (ushort)(uVar6 >> 0x10) & 3 |
                 (ushort)((uVar5 & 0x30000) >> 0xe) |
                 (ushort)((uVar4 & 0x30000) >> 0xc) |
                 (ushort)((uVar3 & 0x30000) >> 10) |
                 (ushort)(uVar10 >> 8) & 0x300 |
                 (ushort)((uVar2 & 0x30000) >> 6) |
                 (ushort)((uVar1 & 0x30000) >> 4) | (ushort)((uVar13 & 0x30000) >> 2);
            upperBits = upperBits + 9;
          } while (k < iStack_1998 + 0x20);
          uVar13 = findSameBlock(this->index16,iVar12,i3_2,this->index16,i3_2,0x24);
          if ((int)uVar13 < 0) {
            if (i3_2 == iVar12) {
              blockLength = 0;
            }
            else {
              blockLength = getOverlap(this->index16,i3_2,this->index16,i3_2,0x24);
            }
            uVar13 = i3_2 - blockLength;
            if (blockLength < 1) {
              i3_2 = i3_2 + 0x24;
            }
            else {
              while (blockLength < 0x24) {
                this->index16[i3_2] = this->index16[iVar8 + blockLength];
                blockLength = blockLength + 1;
                i3_2 = i3_2 + 1;
              }
            }
          }
          n_1 = uVar13 | 0x8000;
        }
        if ((this->index3NullOffset < 0) && (-1 < j)) {
          this->index3NullOffset = n_1;
        }
        *(short *)((long)&index3Start + (long)indexLength * 2) = (short)n_1;
        indexLength = indexLength + 1;
      }
      if (this->index3NullOffset < 0) {
        this->index3NullOffset = 0x7fff;
      }
      if (i3_2 < 0x801f) {
        i_3 = 0x20;
        i2 = this_local._4_4_;
        for (n_3 = 0; n_3 < indexLength; n_3 = i_3 + n_3) {
          if (indexLength - n_3 < i_3) {
            i_3 = indexLength - n_3;
          }
          local_19d0 = findSameBlock(this->index16,iVar12,i3_2,(uint16_t *)&index3Start,n_3,i_3);
          if (local_19d0 < 0) {
            if (i3_2 == iVar12) {
              local_19d4 = 0;
            }
            else {
              local_19d4 = getOverlap(this->index16,i3_2,(uint16_t *)&index3Start,n_3,i_3);
            }
            local_19d0 = i3_2 - local_19d4;
            while (local_19d4 < i_3) {
              this->index16[i3_2] = *(uint16_t *)((long)&index3Start + (long)(n_3 + local_19d4) * 2)
              ;
              local_19d4 = local_19d4 + 1;
              i3_2 = i3_2 + 1;
            }
          }
          this->index16[i2] = (uint16_t)local_19d0;
          i2 = i2 + 1;
        }
        this_local._4_4_ = i3_2;
      }
      else {
        *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        this_local._4_4_ = 0;
      }
    }
  }
  else {
    this->index3NullOffset = 0x7fff;
  }
  return this_local._4_4_;
}

Assistant:

int32_t MutableCodePointTrie::compactIndex(int32_t fastILimit, UErrorCode &errorCode) {
    int32_t fastIndexLength = fastILimit >> (UCPTRIE_FAST_SHIFT - UCPTRIE_SHIFT_3);
    if ((highStart >> UCPTRIE_FAST_SHIFT) <= fastIndexLength) {
        // Only the linear fast index, no multi-stage index tables.
        index3NullOffset = UCPTRIE_NO_INDEX3_NULL_OFFSET;
        return fastIndexLength;
    }

    // Condense the fast index table.
    // Also, does it contain an index-3 block with all dataNullOffset?
    uint16_t fastIndex[UCPTRIE_BMP_INDEX_LENGTH];  // fastIndexLength
    int32_t i3FirstNull = -1;
    for (int32_t i = 0, j = 0; i < fastILimit; ++j) {
        uint32_t i3 = index[i];
        fastIndex[j] = (uint16_t)i3;
        if (i3 == (uint32_t)dataNullOffset) {
            if (i3FirstNull < 0) {
                i3FirstNull = j;
            } else if (index3NullOffset < 0 &&
                    (j - i3FirstNull + 1) == UCPTRIE_INDEX_3_BLOCK_LENGTH) {
                index3NullOffset = i3FirstNull;
            }
        } else {
            i3FirstNull = -1;
        }
        // Set the index entries that compactData() skipped.
        // Needed when the multi-stage index covers the fast index range as well.
        int32_t iNext = i + SMALL_DATA_BLOCKS_PER_BMP_BLOCK;
        while (++i < iNext) {
            i3 += UCPTRIE_SMALL_DATA_BLOCK_LENGTH;
            index[i] = i3;
        }
    }

    // Examine index-3 blocks. For each determine one of:
    // - same as the index-3 null block
    // - same as a fast-index block
    // - 16-bit indexes
    // - 18-bit indexes
    // We store this in the first flags entry for the index-3 block.
    //
    // Also determine an upper limit for the index-3 table length.
    int32_t index3Capacity = 0;
    i3FirstNull = index3NullOffset;
    // If the fast index covers the whole BMP, then
    // the multi-stage index is only for supplementary code points.
    // Otherwise, the multi-stage index covers all of Unicode.
    int32_t iStart = fastILimit < BMP_I_LIMIT ? 0 : BMP_I_LIMIT;
    int32_t iLimit = highStart >> UCPTRIE_SHIFT_3;
    for (int32_t i = iStart; i < iLimit;) {
        int32_t j = i;
        int32_t jLimit = i + UCPTRIE_INDEX_3_BLOCK_LENGTH;
        uint32_t oredI3 = 0;
        bool isNull = true;
        do {
            uint32_t i3 = index[j];
            oredI3 |= i3;
            if (i3 != (uint32_t)dataNullOffset) {
                isNull = false;
            }
        } while (++j < jLimit);
        if (isNull) {
            flags[i] = I3_NULL;
            if (i3FirstNull < 0) {
                if (oredI3 <= 0xffff) {
                    index3Capacity += UCPTRIE_INDEX_3_BLOCK_LENGTH;
                } else {
                    index3Capacity += INDEX_3_18BIT_BLOCK_LENGTH;
                }
                i3FirstNull = 0;
            }
        } else {
            if (oredI3 <= 0xffff) {
                int32_t n = findSameBlock(fastIndex, 0, fastIndexLength,
                                          index, i, UCPTRIE_INDEX_3_BLOCK_LENGTH);
                if (n >= 0) {
                    flags[i] = I3_BMP;
                    index[i] = n;
                } else {
                    flags[i] = I3_16;
                    index3Capacity += UCPTRIE_INDEX_3_BLOCK_LENGTH;
                }
            } else {
                flags[i] = I3_18;
                index3Capacity += INDEX_3_18BIT_BLOCK_LENGTH;
            }
        }
        i = j;
    }

    int32_t index2Capacity = (iLimit - iStart) >> UCPTRIE_SHIFT_2_3;

    // Length of the index-1 table, rounded up.
    int32_t index1Length = (index2Capacity + UCPTRIE_INDEX_2_MASK) >> UCPTRIE_SHIFT_1_2;

    // Index table: Fast index, index-1, index-3, index-2.
    // +1 for possible index table padding.
    int32_t index16Capacity = fastIndexLength + index1Length + index3Capacity + index2Capacity + 1;
    index16 = (uint16_t *)uprv_malloc(index16Capacity * 2);
    if (index16 == nullptr) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        return 0;
    }
    uprv_memcpy(index16, fastIndex, fastIndexLength * 2);

    // Compact the index-3 table and write an uncompacted version of the index-2 table.
    uint16_t index2[UNICODE_LIMIT >> UCPTRIE_SHIFT_2];  // index2Capacity
    int32_t i2Length = 0;
    i3FirstNull = index3NullOffset;
    int32_t index3Start = fastIndexLength + index1Length;
    int32_t indexLength = index3Start;
    for (int32_t i = iStart; i < iLimit; i += UCPTRIE_INDEX_3_BLOCK_LENGTH) {
        int32_t i3;
        uint8_t f = flags[i];
        if (f == I3_NULL && i3FirstNull < 0) {
            // First index-3 null block. Write & overlap it like a normal block, then remember it.
            f = dataNullOffset <= 0xffff ? I3_16 : I3_18;
            i3FirstNull = 0;
        }
        if (f == I3_NULL) {
            i3 = index3NullOffset;
        } else if (f == I3_BMP) {
            i3 = index[i];
        } else if (f == I3_16) {
            int32_t n = findSameBlock(index16, index3Start, indexLength,
                                      index, i, UCPTRIE_INDEX_3_BLOCK_LENGTH);
            if (n >= 0) {
                i3 = n;
            } else {
                if (indexLength == index3Start) {
                    // No overlap at the boundary between the index-1 and index-3 tables.
                    n = 0;
                } else {
                    n = getOverlap(index16, indexLength,
                                   index, i, UCPTRIE_INDEX_3_BLOCK_LENGTH);
                }
                i3 = indexLength - n;
                while (n < UCPTRIE_INDEX_3_BLOCK_LENGTH) {
                    index16[indexLength++] = index[i + n++];
                }
            }
        } else {
            U_ASSERT(f == I3_18);
            // Encode an index-3 block that contains one or more data indexes exceeding 16 bits.
            int32_t j = i;
            int32_t jLimit = i + UCPTRIE_INDEX_3_BLOCK_LENGTH;
            int32_t k = indexLength;
            do {
                ++k;
                uint32_t v = index[j++];
                uint32_t upperBits = (v & 0x30000) >> 2;
                index16[k++] = v;
                v = index[j++];
                upperBits |= (v & 0x30000) >> 4;
                index16[k++] = v;
                v = index[j++];
                upperBits |= (v & 0x30000) >> 6;
                index16[k++] = v;
                v = index[j++];
                upperBits |= (v & 0x30000) >> 8;
                index16[k++] = v;
                v = index[j++];
                upperBits |= (v & 0x30000) >> 10;
                index16[k++] = v;
                v = index[j++];
                upperBits |= (v & 0x30000) >> 12;
                index16[k++] = v;
                v = index[j++];
                upperBits |= (v & 0x30000) >> 14;
                index16[k++] = v;
                v = index[j++];
                upperBits |= (v & 0x30000) >> 16;
                index16[k++] = v;
                index16[k - 9] = upperBits;
            } while (j < jLimit);
            int32_t n = findSameBlock(index16, index3Start, indexLength,
                                      index16, indexLength, INDEX_3_18BIT_BLOCK_LENGTH);
            if (n >= 0) {
                i3 = n | 0x8000;
            } else {
                if (indexLength == index3Start) {
                    // No overlap at the boundary between the index-1 and index-3 tables.
                    n = 0;
                } else {
                    n = getOverlap(index16, indexLength,
                                   index16, indexLength, INDEX_3_18BIT_BLOCK_LENGTH);
                }
                i3 = (indexLength - n) | 0x8000;
                if (n > 0) {
                    int32_t start = indexLength;
                    while (n < INDEX_3_18BIT_BLOCK_LENGTH) {
                        index16[indexLength++] = index16[start + n++];
                    }
                } else {
                    indexLength += INDEX_3_18BIT_BLOCK_LENGTH;
                }
            }
        }
        if (index3NullOffset < 0 && i3FirstNull >= 0) {
            index3NullOffset = i3;
        }
        // Set the index-2 table entry.
        index2[i2Length++] = i3;
    }
    U_ASSERT(i2Length == index2Capacity);
    U_ASSERT(indexLength <= index3Start + index3Capacity);

    if (index3NullOffset < 0) {
        index3NullOffset = UCPTRIE_NO_INDEX3_NULL_OFFSET;
    }
    if (indexLength >= (UCPTRIE_NO_INDEX3_NULL_OFFSET + UCPTRIE_INDEX_3_BLOCK_LENGTH)) {
        // The index-3 offsets exceed 15 bits, or
        // the last one cannot be distinguished from the no-null-block value.
        errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    // Compact the index-2 table and write the index-1 table.
    int32_t blockLength = UCPTRIE_INDEX_2_BLOCK_LENGTH;
    int32_t i1 = fastIndexLength;
    for (int32_t i = 0; i < i2Length; i += blockLength) {
        if ((i2Length - i) < blockLength) {
            // highStart is inside the last index-2 block. Shorten it.
            blockLength = i2Length - i;
        }
        int32_t i2;
        int32_t n = findSameBlock(index16, index3Start, indexLength,
                                  index2, i, blockLength);
        if (n >= 0) {
            i2 = n;
        } else {
            if (indexLength == index3Start) {
                // No overlap at the boundary between the index-1 and index-3/2 tables.
                n = 0;
            } else {
                n = getOverlap(index16, indexLength, index2, i, blockLength);
            }
            i2 = indexLength - n;
            while (n < blockLength) {
                index16[indexLength++] = index2[i + n++];
            }
        }
        // Set the index-1 table entry.
        index16[i1++] = i2;
    }
    U_ASSERT(i1 == index3Start);
    U_ASSERT(indexLength <= index16Capacity);

#ifdef UCPTRIE_DEBUG
    /* we saved some space */
    printf("compacting UCPTrie: count of 16-bit index words %lu->%lu\n",
            (long)iLimit, (long)indexLength);
#endif

    return indexLength;
}